

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

void __thiscall embree::Geometry::preCommit(Geometry *this)

{
  exception *this_00;
  long in_RDI;
  allocator local_51;
  string local_50 [56];
  string *local_18;
  undefined4 local_c;
  exception *local_8;
  
  if ((*(uint *)(in_RDI + 0x3c) >> 0x13 & 3) == 0) {
    this_00 = (exception *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"geometry not committed",&local_51);
    local_c = 3;
    local_18 = local_50;
    local_8 = this_00;
    std::exception::exception(this_00);
    *(undefined ***)this_00 = &PTR__rtcore_error_005b1508;
    *(undefined4 *)(this_00 + 8) = local_c;
    std::__cxx11::string::string((string *)(this_00 + 0x10),local_18);
    __cxa_throw(this_00,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  return;
}

Assistant:

void Geometry::preCommit()
  {
    if (State::MODIFIED == (State)state)
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"geometry not committed");
  }